

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPTCPTransmitter::Create
          (RTPTCPTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  RTPAbortDescriptors *pRVar1;
  int iVar2;
  RTPTransmissionParams *pRVar3;
  _func_int **local_18;
  
  pRVar3 = (RTPTransmissionParams *)&local_18;
  local_18 = (_func_int **)0x0;
  iVar2 = -0xb5;
  if ((this->m_init == true) && (iVar2 = -0xb7, this->m_created == false)) {
    if (transparams != (RTPTransmissionParams *)0x0) {
      if (transparams->protocol != TCPProto) {
        return -0xb8;
      }
      pRVar3 = transparams + 1;
    }
    if (pRVar3->_vptr_RTPTransmissionParams == (_func_int **)0x0) {
      iVar2 = RTPAbortDescriptors::Init(&this->m_abortDesc);
      if (iVar2 < 0) {
        return iVar2;
      }
      this->m_pAbortDesc = &this->m_abortDesc;
    }
    else {
      pRVar1 = (RTPAbortDescriptors *)pRVar3->_vptr_RTPTransmissionParams;
      this->m_pAbortDesc = pRVar1;
      if (pRVar1->m_init != true) {
        return -0xae;
      }
    }
    this->m_created = true;
    this->m_waitingForData = false;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

RTPTCPTransmitter::~RTPTCPTransmitter()
{
	Destroy();
}